

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerup::DoEffect(APowerup *this)

{
  bool bVar1;
  uint32 blend;
  int iVar2;
  AActor *pAVar3;
  int Colormap;
  APowerup *this_local;
  
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_AInventory).Owner,(AActor *)0x0);
  if (((!bVar1) &&
      (pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner),
      pAVar3->player != (player_t *)0x0)) && (0 < *(int *)&(this->super_AInventory).field_0x4dc)) {
    blend = PalEntry::operator_cast_to_unsigned_int(&this->BlendColor);
    iVar2 = GetSpecialColormap(blend);
    if (iVar2 != -1) {
      if ((*(int *)&(this->super_AInventory).field_0x4dc < 0x81) &&
         ((*(uint *)&(this->super_AInventory).field_0x4dc & 8) == 0)) {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
        if (pAVar3->player->fixedcolormap == iVar2) {
          pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
          pAVar3->player->fixedcolormap = -1;
        }
      }
      else {
        pAVar3 = TObjPtr<AActor>::operator->(&(this->super_AInventory).Owner);
        pAVar3->player->fixedcolormap = (short)iVar2;
      }
    }
  }
  return;
}

Assistant:

void APowerup::DoEffect ()
{
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (EffectTics > 0)
	{
		int Colormap = GetSpecialColormap(BlendColor);

		if (Colormap != NOFIXEDCOLORMAP)
		{
			if (EffectTics > BLINKTHRESHOLD || (EffectTics & 8))
			{
				Owner->player->fixedcolormap = Colormap;
			}
			else if (Owner->player->fixedcolormap == Colormap)	
			{
				// only unset if the fixed colormap comes from this item
				Owner->player->fixedcolormap = NOFIXEDCOLORMAP;
			}
		}
	}
}